

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_settable_sskey(lua_State *L,TValue *t,TValue *key,StkId val)

{
  TString *key_00;
  TKey *pTVar1;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  int nx;
  TValue *k;
  Node *n;
  Node *local_10;
  
  if (t->tt_ != 0x8005) {
    if ((t->tt_ & 0xf) != 5) {
      luaV_finishset(L,t,key,val,(TValue *)0x0);
      return;
    }
    luaG_typeerror(L,t,"incorrectly index");
  }
  if (t->tt_ != 0x8005) {
    __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc67,"void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
  }
  if (((t->value_).gc)->tt != '\x05') {
    __assert_fail("(((t)->value_).gc)->tt == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc67,"void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
  }
  if ((key->tt_ & 0xf) != 4) {
    __assert_fail("(((((((key))->tt_)) & 0x0F)) == (4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc67,"void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
  }
  if ((((key->value_).gc)->tt & 0xf) != 4) {
    __assert_fail("(((((key)->value_).gc)->tt) & 0x0F) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc67,"void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
  }
  key_00 = (TString *)(key->value_).gc;
  local_10 = (Node *)(*(long *)((t->value_).f + 0x18) +
                     (ulong)(key_00->hash & *(uint *)((t->value_).f + 0x38)) * 0x20);
  if (key_00->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar1 = &local_10->i_key;
  if ((local_10->i_key).nk.tt_ == 0x8004) {
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar1->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar1->nk).value_.gc != key_00) goto LAB_00160a25;
  }
  else {
LAB_00160a25:
    if ((local_10->i_key).nk.next == 0) {
      local_10 = (Node *)&luaO_nilobject_;
    }
    else {
      local_10 = (Node *)luaH_getshortstr_continue(key_00,local_10);
    }
  }
  if ((local_10->i_val).tt_ == 0) {
    luaV_finishset(L,t,key,val,&local_10->i_val);
  }
  else {
    (local_10->i_val).value_ = val->value_;
    (local_10->i_val).tt_ = val->tt_;
    if (((local_10->i_val).tt_ & 0x8000) != 0) {
      if (((local_10->i_val).tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc67,
                      "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
      }
      if (((local_10->i_val).tt_ & 0x7f) != (ushort)((local_10->i_val).value_.gc)->tt) {
LAB_00160b60:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc67,
                      "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if (((local_10->i_val).tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xc67,
                        "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
        }
        if ((((local_10->i_val).value_.gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
        goto LAB_00160b60;
      }
    }
    if ((val->tt_ & 0x8000) != 0) {
      if ((t->tt_ & 0x8000) == 0) {
        __assert_fail("(((t)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc67,
                      "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
      }
      if ((((t->value_).gc)->marked & 0x20) != 0) {
        if ((val->tt_ & 0x8000) == 0) {
          __assert_fail("(((val)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xc67,
                        "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)");
        }
        if ((((val->value_).gc)->marked & 0x18) != 0) {
          if ((t->tt_ & 0x8000) == 0) {
            __assert_fail("(((t)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xc67,
                          "void raviV_settable_sskey(lua_State *, const TValue *, TValue *, StkId)")
            ;
          }
          luaC_barrierback_(L,(t->value_).gc);
        }
      }
    }
  }
  return;
}

Assistant:

void raviV_settable_sskey(lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE_SSKEY(L, t, key, val);
}